

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O1

void ssh1_bpp_start_compression(BinaryPacketProtocol *bpp)

{
  long lVar1;
  LogContext *ctx;
  ssh_compressor *psVar2;
  ssh_decompressor *psVar3;
  char *event;
  
  if (bpp->vt != &ssh1_bpp_vtable) {
    __assert_fail("bpp->vt == &ssh1_bpp_vtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                  0x6c,"void ssh1_bpp_start_compression(BinaryPacketProtocol *)");
  }
  if (*(long *)&bpp[-1].ic_out_pq.queued == 0) {
    lVar1._0_4_ = bpp[-1].remote_bugs;
    lVar1._4_1_ = bpp[-1].ext_info_rsa_sha256_ok;
    lVar1._5_1_ = bpp[-1].ext_info_rsa_sha512_ok;
    lVar1._6_1_ = bpp[-1].expect_close;
    lVar1._7_1_ = bpp[-1].field_0xdf;
    if (lVar1 == 0) {
      psVar2 = zlib_compress_init();
      *(ssh_compressor **)&bpp[-1].ic_out_pq.queued = psVar2;
      psVar3 = zlib_decompress_init();
      *(ssh_decompressor **)&bpp[-1].remote_bugs = psVar3;
      ctx = bpp->logctx;
      event = dupprintf("Started zlib (RFC1950) compression");
      logevent_and_free(ctx,event);
      return;
    }
    __assert_fail("!s->decompctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                  0x70,"void ssh1_bpp_start_compression(BinaryPacketProtocol *)");
  }
  __assert_fail("!s->compctx",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",0x6f,
                "void ssh1_bpp_start_compression(BinaryPacketProtocol *)");
}

Assistant:

void ssh1_bpp_start_compression(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s;
    assert(bpp->vt == &ssh1_bpp_vtable);
    s = container_of(bpp, struct ssh1_bpp_state, bpp);

    assert(!s->compctx);
    assert(!s->decompctx);

    s->compctx = ssh_compressor_new(&ssh_zlib);
    s->decompctx = ssh_decompressor_new(&ssh_zlib);

    bpp_logevent("Started zlib (RFC1950) compression");
}